

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_allocator.hpp
# Opt level: O3

ThreadCache * __thiscall
tcmalloc::FixedAllocator<tcmalloc::ThreadCache>::AllocFromArea
          (FixedAllocator<tcmalloc::ThreadCache> *this)

{
  ThreadCache *pTVar1;
  uint64_t uVar2;
  
  if (this->area_free_ < 0x1050) {
    pTVar1 = (ThreadCache *)mmap((void *)0x0,0x8000000,3,0x22,-1,0);
    if (pTVar1 == (ThreadCache *)0xffffffffffffffff) {
      return (ThreadCache *)0x0;
    }
    uVar2 = 0x7ffefb0;
  }
  else {
    pTVar1 = (ThreadCache *)this->area_;
    uVar2 = this->area_free_ - 0x1050;
  }
  this->area_ = (char *)(pTVar1 + 1);
  this->area_free_ = uVar2;
  return pTVar1;
}

Assistant:

T *AllocFromArea() {
        if (area_free_ < sizeof(T)) {
            void *ptr = SystemAlloc(areaSize_);
            if (ptr == (void *) (-1)) {
                return nullptr;
            }
            area_ = (char *) ptr;
            area_free_ = areaSize_;
        }
        void *result = area_;
        area_ += sizeof(T);
        area_free_ -= sizeof(T);
        return reinterpret_cast<T *>(result);
    }